

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

void __thiscall
CVmConsoleBanner::CVmConsoleBanner
          (CVmConsoleBanner *this,void *banner_handle,int win_type,unsigned_long style)

{
  int iVar1;
  CVmFormatter *this_00;
  ushort uVar2;
  os_banner_info_t *ctx;
  os_banner_info_t info;
  os_banner_info_t oStack_58;
  
  ctx = &oStack_58;
  (this->super_CVmConsole).script_sp_ = (script_stack_entry *)0x0;
  (this->super_CVmConsole).command_fp_ = (CVmDataSource *)0x0;
  (this->super_CVmConsole).command_nf_ = (CVmNetFile *)0x0;
  (this->super_CVmConsole).command_glob_ = (vm_globalvar_t *)0x0;
  (this->super_CVmConsole).log_str_ = (CVmFormatterLog *)0x0;
  (this->super_CVmConsole).field_0x18 = (this->super_CVmConsole).field_0x18 & 0xfe | 2;
  (this->super_CVmConsole)._vptr_CVmConsole = (_func_int **)&PTR_delete_obj_00327458;
  this->banner_ = banner_handle;
  iVar1 = os_banner_getinfo(banner_handle,&oStack_58);
  if (iVar1 == 0) {
    oStack_58.os_line_wrap = 0;
  }
  if (win_type == 2) {
    oStack_58.os_line_wrap = 1;
  }
  uVar2 = (ushort)(win_type == 2);
  this_00 = (CVmFormatter *)operator_new(0xf058);
  iVar1 = oStack_58.os_line_wrap;
  this_00->console_ = &this->super_CVmConsole;
  this_00->tabs_ = (CVmHashTable *)0x0;
  this_00->cmap_ = (CCharmapToLocal *)0x0;
  this_00->html_title_buf_ = (char *)0x0;
  this_00->html_title_buf_size_ = 0;
  ((CVmFormatter *)&this_00->_vptr_CVmFormatter)->_vptr_CVmFormatter =
       (_func_int **)&PTR_delete_obj_003277a0;
  ((CVmFormatter *)&this_00[1]._vptr_CVmFormatter)->_vptr_CVmFormatter = (_func_int **)banner_handle
  ;
  *(int *)&this_00[1].console_ = win_type;
  this_00[1].cmap_ = (CCharmapToLocal *)style;
  (this->super_CVmConsole).disp_str_ = this_00;
  CVmFormatterDisp::init((CVmFormatterDisp *)this_00,(EVP_PKEY_CTX *)ctx);
  *(ushort *)&this_00->field_0xef81 =
       (short)((iVar1 & 1U) << 8) + uVar2 * 2 | *(ushort *)&this_00->field_0xef81 & 0xfefc | uVar2;
  this->win_type_ = win_type;
  return;
}

Assistant:

CVmConsoleBanner::CVmConsoleBanner(void *banner_handle, int win_type,
                                   unsigned long style)
{
    CVmFormatterBanner *str;
    os_banner_info_t info;
    int obey_whitespace = FALSE;
    int literal_mode = FALSE;

    /* remember our OS-level banner handle */
    banner_ = banner_handle;

    /* get osifc-level information on the banner */
    if (!os_banner_getinfo(banner_, &info))
        info.os_line_wrap = FALSE;

    /* 
     *   If it's a text grid window, don't do any line wrapping.  Text grids
     *   simply don't have any line wrapping, so we don't want to impose any
     *   at the formatter level.  Set the formatter to "os line wrap" mode,
     *   to indicate that the formatter doesn't do wrapping - even though
     *   the underlying OS banner window won't do any wrapping either, the
     *   lack of line wrapping counts as OS handling of line wrapping.  
     */
    if (win_type == OS_BANNER_TYPE_TEXTGRID)
    {
        /* do not wrap lines in the formatter */
        info.os_line_wrap = TRUE;

        /* use literal mode, and obey whitespace literally */
        literal_mode = TRUE;
        obey_whitespace = TRUE;
    }

    /* create and initialize our display stream */
    disp_str_ = str = new CVmFormatterBanner(banner_handle, this,
                                             win_type, style);
    str->init_banner(info.os_line_wrap, obey_whitespace, literal_mode);

    /* remember our window type */
    win_type_ = win_type;
}